

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

void __thiscall Fl_Shared_Image::color_average(Fl_Shared_Image *this,Fl_Color c,float i)

{
  int iVar1;
  Fl_Image *pFVar2;
  
  if (this->image_ != (Fl_Image *)0x0) {
    (*this->image_->_vptr_Fl_Image[3])();
    pFVar2 = this->image_;
    if (pFVar2 != (Fl_Image *)0x0) {
      (this->super_Fl_Image).w_ = pFVar2->w_;
      (this->super_Fl_Image).h_ = pFVar2->h_;
      (this->super_Fl_Image).d_ = pFVar2->d_;
      iVar1 = pFVar2->count_;
      (this->super_Fl_Image).data_ = pFVar2->data_;
      (this->super_Fl_Image).count_ = iVar1;
    }
  }
  return;
}

Assistant:

void
Fl_Shared_Image::color_average(Fl_Color c,	// I - Color to blend with
                               float    i) {	// I - Blend fraction
  if (!image_) return;

  image_->color_average(c, i);
  update();
}